

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_2_lambda(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  PVIPNode **ppPVar2;
  
  ppPVar2 = G->val;
  pPVar1 = ppPVar2[-2];
  if (pPVar1 == (PVIPNode *)0x0) {
    pPVar1 = PVIP_node_new_children(&G->data,PVIP_NODE_PARAMS);
    G->val[-2] = pPVar1;
    ppPVar2 = G->val;
    pPVar1 = ppPVar2[-2];
  }
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_LAMBDA,pPVar1,ppPVar2[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_lambda(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define p G->val[-2]
  yyprintf((stderr, "do yy_2_lambda"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        if (!p) {\n\
            p = PVIP_node_new_children(&(G->data), PVIP_NODE_PARAMS);\n\
        }\n\
        yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_LAMBDA, p, b);\n\
    }\n"));
  
        if (!p) {
            p = PVIP_node_new_children(&(G->data), PVIP_NODE_PARAMS);
        }
        yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_LAMBDA, p, b);
    ;
#undef b
#undef p
}